

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-pipe.c
# Opt level: O0

int lws_plat_pipe_signal(lws *wsi)

{
  int iVar1;
  eventfd_t value;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  iVar1 = eventfd_write(wsi->context->pt[(int)wsi->tsi].dummy_pipe_fds[0],1);
  return iVar1;
}

Assistant:

int
lws_plat_pipe_signal(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
#if defined(LWS_HAVE_EVENTFD)
	eventfd_t value = 1;
	return eventfd_write(pt->dummy_pipe_fds[0], value);
#else
	char buf = 0;
	int n;

	n = write(pt->dummy_pipe_fds[1], &buf, 1);

	return n != 1;
#endif
}